

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_buildCTable_wksp
                 (HUF_CElt *tree,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  U16 UVar1;
  uint uVar2;
  U32 UVar3;
  nodeElt *huffNode_00;
  ulong uVar4;
  uint local_b4;
  uint local_b0;
  U16 local_aa;
  U16 local_a8 [3];
  U16 min;
  U16 valPerRank [13];
  U16 aUStack_86 [3];
  U16 nbPerRank [13];
  U32 n2;
  U32 n1;
  U32 nodeRoot;
  uint uStack_54;
  U16 nodeNb;
  int lowN;
  int lowS;
  U32 nonNullRank;
  U32 n;
  nodeElt *huffNode;
  nodeElt *huffNode0;
  size_t wkspSize_local;
  void *workSpace_local;
  U32 maxNbBits_local;
  U32 maxSymbolValue_local;
  uint *count_local;
  HUF_CElt *tree_local;
  
  huffNode_00 = (nodeElt *)((long)workSpace + 8);
  if (((ulong)workSpace & 3) == 0) {
    if (wkspSize < 0x1000) {
      tree_local = (HUF_CElt *)0xffffffffffffffbe;
    }
    else {
      workSpace_local._0_4_ = maxNbBits;
      if (maxNbBits == 0) {
        workSpace_local._0_4_ = 0xb;
      }
      if (maxSymbolValue < 0x100) {
        memset(workSpace,0,0x1000);
        HUF_sort(huffNode_00,count,maxSymbolValue);
        lowN = maxSymbolValue;
        while (huffNode_00[(uint)lowN].count == 0) {
          lowN = lowN + -1;
        }
        uVar2 = lowN + 0xff;
        nodeRoot = 0x100;
        *(U32 *)((long)workSpace + 0x808) = huffNode_00[lowN].count + huffNode_00[lowN + -1].count;
        *(undefined2 *)((long)workSpace + (long)(lowN + -1) * 8 + 0xc) = 0x100;
        *(undefined2 *)((long)workSpace + (long)lowN * 8 + 0xc) = 0x100;
        n1._2_2_ = 0x101;
        uStack_54 = lowN - 2;
        for (lowS = 0x101; (uint)lowS <= uVar2; lowS = lowS + 1) {
          huffNode_00[(uint)lowS].count = 0x40000000;
        }
        *(undefined4 *)workSpace = 0x80000000;
        for (; n1._2_2_ <= uVar2; n1._2_2_ = n1._2_2_ + 1) {
          if (huffNode_00[(int)uStack_54].count < huffNode_00[(int)nodeRoot].count) {
            local_b0 = uStack_54;
            uStack_54 = uStack_54 - 1;
          }
          else {
            local_b0 = nodeRoot;
            nodeRoot = nodeRoot + 1;
          }
          if (huffNode_00[(int)uStack_54].count < huffNode_00[(int)nodeRoot].count) {
            local_b4 = uStack_54;
            uStack_54 = uStack_54 - 1;
          }
          else {
            local_b4 = nodeRoot;
            nodeRoot = nodeRoot + 1;
          }
          huffNode_00[n1._2_2_].count = huffNode_00[local_b0].count + huffNode_00[local_b4].count;
          *(ushort *)((long)workSpace + (ulong)local_b4 * 8 + 0xc) = n1._2_2_;
          *(ushort *)((long)workSpace + (ulong)local_b0 * 8 + 0xc) = n1._2_2_;
        }
        *(undefined1 *)((long)workSpace + (ulong)uVar2 * 8 + 0xf) = 0;
        for (lowS = lowN + 0xfe; 0xff < (uint)lowS; lowS = lowS + -1) {
          *(char *)((long)workSpace + (ulong)(uint)lowS * 8 + 0xf) =
               *(char *)((long)workSpace +
                        (ulong)*(ushort *)((long)workSpace + (ulong)(uint)lowS * 8 + 0xc) * 8 + 0xf)
               + '\x01';
        }
        for (lowS = 0; (uint)lowS <= (uint)lowN; lowS = lowS + 1) {
          *(char *)((long)workSpace + (ulong)(uint)lowS * 8 + 0xf) =
               *(char *)((long)workSpace +
                        (ulong)*(ushort *)((long)workSpace + (ulong)(uint)lowS * 8 + 0xc) * 8 + 0xf)
               + '\x01';
        }
        UVar3 = HUF_setMaxHeight(huffNode_00,lowN,(U32)workSpace_local);
        memset(valPerRank + 0xc,0,0x1a);
        memset(local_a8,0,0x1a);
        if (UVar3 < 0xd) {
          for (lowS = 0; (uint)lowS <= (uint)lowN; lowS = lowS + 1) {
            uVar4 = (ulong)*(byte *)((long)workSpace + (ulong)(uint)lowS * 8 + 0xf);
            valPerRank[uVar4 + 0xc] = valPerRank[uVar4 + 0xc] + 1;
          }
          local_aa = 0;
          for (lowS = UVar3; lowS != 0; lowS = lowS + -1) {
            local_a8[(uint)lowS] = local_aa;
            local_aa = (U16)((int)(uint)(ushort)(local_aa + valPerRank[(ulong)(uint)lowS + 0xc]) >>
                            1);
          }
          for (lowS = 0; (uint)lowS <= maxSymbolValue; lowS = lowS + 1) {
            tree[*(byte *)((long)workSpace + (ulong)(uint)lowS * 8 + 0xe)].nbBits =
                 *(BYTE *)((long)workSpace + (ulong)(uint)lowS * 8 + 0xf);
          }
          for (lowS = 0; (uint)lowS <= maxSymbolValue; lowS = lowS + 1) {
            UVar1 = local_a8[tree[(uint)lowS].nbBits];
            local_a8[tree[(uint)lowS].nbBits] = UVar1 + 1;
            tree[(uint)lowS].val = UVar1;
          }
          tree_local = (HUF_CElt *)(ulong)UVar3;
        }
        else {
          tree_local = (HUF_CElt *)0xffffffffffffffff;
        }
      }
      else {
        tree_local = (HUF_CElt *)0xffffffffffffffd2;
      }
    }
  }
  else {
    tree_local = (HUF_CElt *)0xffffffffffffffff;
  }
  return (size_t)tree_local;
}

Assistant:

size_t HUF_buildCTable_wksp (HUF_CElt* tree, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits, void* workSpace, size_t wkspSize)
{
    nodeElt* const huffNode0 = (nodeElt*)workSpace;
    nodeElt* const huffNode = huffNode0+1;
    U32 n, nonNullRank;
    int lowS, lowN;
    U16 nodeNb = STARTNODE;
    U32 nodeRoot;

    /* safety checks */
    if (((size_t)workSpace & 3) != 0) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (wkspSize < sizeof(huffNodeTable)) return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue);

    /* init for parents */
    nonNullRank = maxSymbolValue;
    while(huffNode[nonNullRank].count == 0) nonNullRank--;
    lowS = nonNullRank; nodeRoot = nodeNb + lowS - 1; lowN = nodeNb;
    huffNode[nodeNb].count = huffNode[lowS].count + huffNode[lowS-1].count;
    huffNode[lowS].parent = huffNode[lowS-1].parent = nodeNb;
    nodeNb++; lowS-=2;
    for (n=nodeNb; n<=nodeRoot; n++) huffNode[n].count = (U32)(1U<<30);
    huffNode0[0].count = (U32)(1U<<31);  /* fake entry, strong barrier */

    /* create parents */
    while (nodeNb <= nodeRoot) {
        U32 n1 = (huffNode[lowS].count < huffNode[lowN].count) ? lowS-- : lowN++;
        U32 n2 = (huffNode[lowS].count < huffNode[lowN].count) ? lowS-- : lowN++;
        huffNode[nodeNb].count = huffNode[n1].count + huffNode[n2].count;
        huffNode[n1].parent = huffNode[n2].parent = nodeNb;
        nodeNb++;
    }

    /* distribute weights (unlimited tree height) */
    huffNode[nodeRoot].nbBits = 0;
    for (n=nodeRoot-1; n>=STARTNODE; n--)
        huffNode[n].nbBits = huffNode[ huffNode[n].parent ].nbBits + 1;
    for (n=0; n<=nonNullRank; n++)
        huffNode[n].nbBits = huffNode[ huffNode[n].parent ].nbBits + 1;

    /* enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, nonNullRank, maxNbBits);

    /* fill result into tree (val, nbBits) */
    {   U16 nbPerRank[HUF_TABLELOG_MAX+1] = {0};
        U16 valPerRank[HUF_TABLELOG_MAX+1] = {0};
        if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */
        for (n=0; n<=nonNullRank; n++)
            nbPerRank[huffNode[n].nbBits]++;
        /* determine stating value per rank */
        {   U16 min = 0;
            for (n=maxNbBits; n>0; n--) {
                valPerRank[n] = min;      /* get starting value within each rank */
                min += nbPerRank[n];
                min >>= 1;
        }   }
        for (n=0; n<=maxSymbolValue; n++)
            tree[huffNode[n].byte].nbBits = huffNode[n].nbBits;   /* push nbBits per symbol, symbol order */
        for (n=0; n<=maxSymbolValue; n++)
            tree[n].val = valPerRank[tree[n].nbBits]++;   /* assign value within rank, symbol order */
    }

    return maxNbBits;
}